

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::FloorDecimalOperator::Operation<long,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  anon_class_8_1_c17bcc2d fun;
  reference count;
  Vector *in_RDX;
  byte in_SIL;
  DataChunk *in_RDI;
  long power_of_ten;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  
  fun.power_of_ten =
       (long *)UnsafeNumericCast<long,long,void>((&NumericHelper::POWERS_OF_TEN)[in_SIL]);
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  DataChunk::size(in_RDI);
  UnaryExecutor::
  Execute<long,long,duckdb::FloorDecimalOperator::Operation<long,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(long)_1_>
            ((Vector *)&stack0xffffffffffffffe0,in_RDX,(idx_t)count,fun,CANNOT_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				// below 0 we ceil the number (e.g. -10.5 -> -11)
				return UnsafeNumericCast<T>(((input + 1) / power_of_ten) - 1);
			} else {
				// above 0 we floor the number
				return UnsafeNumericCast<T>(input / power_of_ten);
			}
		});
	}